

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverageFuncs.cpp
# Opt level: O3

Expression * __thiscall
slang::ast::builtins::CoverageNameOrHierFunc::bindArgument
          (CoverageNameOrHierFunc *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax
          ,Args *args)

{
  bool bVar1;
  Expression *pEVar2;
  pointer ppTVar3;
  
  ppTVar3 = (this->argTypes).
            super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->argTypes).
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3) <= argIndex) {
    pEVar2 = SystemSubroutine::bindArgument
                       (&this->super_SystemSubroutine,argIndex,context,syntax,args);
    return pEVar2;
  }
  if (this->nameOrHierIndex == argIndex) {
    bVar1 = slang::syntax::NameSyntax::isKind((syntax->super_SyntaxNode).kind);
    if (bVar1) {
      pEVar2 = ArbitrarySymbolExpression::fromSyntax
                         (((context->scope).ptr)->compilation,(NameSyntax *)syntax,context,
                          (bitmask<slang::ast::LookupFlags>)0x100);
      return pEVar2;
    }
    ppTVar3 = (this->argTypes).
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  pEVar2 = Expression::bindArgument
                     (ppTVar3[argIndex],In,(bitmask<slang::ast::VariableFlags>)0x0,syntax,context);
  return pEVar2;
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        if (argIndex >= argTypes.size())
            return SystemSubroutine::bindArgument(argIndex, context, syntax, args);

        if (argIndex == nameOrHierIndex && NameSyntax::isKind(syntax.kind)) {
            return ArbitrarySymbolExpression::fromSyntax(context.getCompilation(),
                                                         syntax.as<NameSyntax>(), context,
                                                         LookupFlags::AllowRoot);
        }

        return Expression::bindArgument(*argTypes[argIndex], ArgumentDirection::In, {}, syntax,
                                        context);
    }